

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O1

void anon_unknown.dwarf_638344::init_curious_in_channel(Caliper *c,Channel *channel)

{
  _Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
  *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __node_ptr p_Var3;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> _Var4;
  curious_t curious_inst;
  Events *pEVar5;
  user_data_t *usr_args;
  cali_id_t cVar6;
  __node_ptr p_Var7;
  __node_ptr p_Var8;
  _Hash_node_base **pp_Var9;
  _Hash_node_base *p_Var10;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  size_type __n;
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  __buckets_alloc_type __alloc;
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  data;
  new_allocator<std::__detail::_Hash_node_base_*> local_61;
  _Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false> local_60;
  _Scoped_node local_58;
  cali_id_t local_48;
  __uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  local_40;
  Caliper *local_38;
  
  local_38 = c;
  pEVar5 = cali::Channel::events(channel);
  cali::util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
            (&pEVar5->subscribe_attribute,&local_38,
             (Attribute *)&(anonymous_namespace)::io_region_attr);
  curious_inst = curious_init(3);
  usr_args = (user_data_t *)operator_new(0x18);
  usr_args->curious_ctx = curious_inst;
  (usr_args->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (channel->mP).super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (usr_args->channel).mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_60._M_head_impl = usr_args;
  curious_register_callback(curious_inst,0,handle_io<curious_read_record>,usr_args);
  curious_register_callback(curious_inst,1,handle_io<curious_read_record>,usr_args);
  curious_register_callback(curious_inst,2,handle_io<curious_write_record>,usr_args);
  curious_register_callback(curious_inst,3,handle_io<curious_write_record>,usr_args);
  curious_register_callback(curious_inst,4,handle_io<curious_metadata_record>,usr_args);
  curious_register_callback(curious_inst,5,handle_io<curious_metadata_record>,usr_args);
  cVar6 = cali::Channel::id(channel);
  _Var4._M_head_impl = local_60._M_head_impl;
  local_40._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )local_60._M_head_impl;
  local_60._M_head_impl = (user_data_t *)0x0;
  local_58._M_h = (__hashtable_alloc *)&(anonymous_namespace)::curious_insts;
  local_48 = cVar6;
  p_Var7 = (__node_ptr)operator_new(0x18);
  (p_Var7->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  *(cali_id_t *)
   &(p_Var7->
    super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
    ).
    super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
    ._M_storage._M_storage = cVar6;
  *(user_data_t **)
   ((long)&(p_Var7->
           super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
           ).
           super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
           ._M_storage._M_storage + 8) = _Var4._M_head_impl;
  uVar12 = DAT_00284580;
  local_40._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )(_Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          )0x0;
  this = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)(cVar6 % DAT_00284580);
  local_58._M_node = p_Var7;
  p_Var8 = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node(this,(size_type)
                               &p_Var7->
                                super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
                          ,(key_type *)this,(__hash_code)usr_args);
  if (p_Var8 == (__node_ptr)0x0) {
    auVar13 = std::__detail::_Prime_rehash_policy::_M_need_rehash(0x284598,uVar12,DAT_00284590);
    __n = auVar13._8_8_;
    if ((auVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        _DAT_002845a8 = 0;
        pp_Var9 = (_Hash_node_base **)&DAT_002845a8;
      }
      else {
        pp_Var9 = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                            (&local_61,__n,(void *)0x0);
        memset(pp_Var9,0,__n * 8);
      }
      p_Var8 = DAT_00284588;
      DAT_00284588 = (__node_ptr)0x0;
      if (p_Var8 != (__node_ptr)0x0) {
        uVar12 = 0;
        do {
          p_Var3 = (__node_ptr)(p_Var8->super__Hash_node_base)._M_nxt;
          uVar11 = *(ulong *)&(p_Var8->
                              super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
                              ).
                              super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
                              ._M_storage._M_storage % __n;
          if (pp_Var9[uVar11] == (_Hash_node_base *)0x0) {
            (p_Var8->super__Hash_node_base)._M_nxt = &DAT_00284588->super__Hash_node_base;
            DAT_00284588 = p_Var8;
            pp_Var9[uVar11] = (_Hash_node_base *)&DAT_00284588;
            if ((p_Var8->super__Hash_node_base)._M_nxt != (_Hash_node_base *)0x0) {
              p_Var10 = (_Hash_node_base *)(pp_Var9 + uVar12);
              goto LAB_0021e51b;
            }
          }
          else {
            (p_Var8->super__Hash_node_base)._M_nxt = pp_Var9[uVar11]->_M_nxt;
            p_Var10 = pp_Var9[uVar11];
            uVar11 = uVar12;
LAB_0021e51b:
            p_Var10->_M_nxt = &p_Var8->super__Hash_node_base;
          }
          p_Var8 = p_Var3;
          uVar12 = uVar11;
        } while (p_Var3 != (__node_ptr)0x0);
      }
      if ((anonymous_namespace)::curious_insts != (_Hash_node_base **)&DAT_002845a8) {
        operator_delete((anonymous_namespace)::curious_insts,DAT_00284580 << 3);
      }
      this = (_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)(cVar6 % __n);
      (anonymous_namespace)::curious_insts = pp_Var9;
      DAT_00284580 = __n;
    }
    pp_Var9 = (anonymous_namespace)::curious_insts;
    if ((anonymous_namespace)::curious_insts[(long)this] == (_Hash_node_base *)0x0) {
      (p_Var7->super__Hash_node_base)._M_nxt = &DAT_00284588->super__Hash_node_base;
      if (DAT_00284588 != (__node_ptr)0x0) {
        p_Var1 = &DAT_00284588->
                  super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_false>
        ;
        DAT_00284588 = p_Var7;
        pp_Var9[*(ulong *)&(p_Var1->
                           super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>
                           )._M_storage._M_storage % DAT_00284580] = (_Hash_node_base *)p_Var7;
        p_Var7 = DAT_00284588;
      }
      DAT_00284588 = p_Var7;
      (anonymous_namespace)::curious_insts[(long)this] = (_Hash_node_base *)&DAT_00284588;
    }
    else {
      (p_Var7->super__Hash_node_base)._M_nxt =
           (anonymous_namespace)::curious_insts[(long)this]->_M_nxt;
      pp_Var9[(long)this]->_M_nxt = (_Hash_node_base *)p_Var7;
    }
    DAT_00284590 = DAT_00284590 + 1;
    local_58._M_node = (__node_ptr)0x0;
  }
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Scoped_node::~_Scoped_node(&local_58);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                 *)&local_40);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                 *)&local_60);
  return;
}

Assistant:

void init_curious_in_channel(Caliper* c, Channel* channel)
{
    channel->events().subscribe_attribute(c, io_region_attr);

    curious_t curious_inst = curious_init(CURIOUS_ALL_APIS);
    auto      data         = std::unique_ptr<user_data_t>(new user_data_t { curious_inst, *channel });

    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );

    curious_insts.insert(std::make_pair(channel->id(), std::move(data)));
}